

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t ts_message_decode_json(TsMessageRef_t message,cJSON *value)

{
  int iVar1;
  TsMessageRef_t local_30;
  TsMessageRef_t content;
  cJSON *pcStack_20;
  TsStatus_t status;
  cJSON *value_local;
  TsMessageRef_t message_local;
  
  content._4_4_ = TsStatusOk;
  pcStack_20 = value;
  value_local = (cJSON *)message;
  do {
    if (pcStack_20 == (cJSON *)0x0) {
      return content._4_4_;
    }
    iVar1 = pcStack_20->type;
    if (iVar1 == 0) {
      return TsStatusErrorNotImplemented;
    }
    if (iVar1 == 1) {
      content._4_4_ = ts_message_set_bool((TsMessageRef_t)value_local,pcStack_20->string,false);
    }
    else if (iVar1 == 2) {
      content._4_4_ = ts_message_set_bool((TsMessageRef_t)value_local,pcStack_20->string,true);
    }
    else if (iVar1 == 4) {
      content._4_4_ = ts_message_set_null((TsMessageRef_t)value_local,pcStack_20->string);
    }
    else if (iVar1 == 8) {
      if ((pcStack_20->valuedouble != (double)pcStack_20->valueint) ||
         (NAN(pcStack_20->valuedouble) || NAN((double)pcStack_20->valueint))) {
        content._4_4_ =
             ts_message_set_float
                       ((TsMessageRef_t)value_local,pcStack_20->string,
                        (float)pcStack_20->valuedouble);
      }
      else {
        content._4_4_ =
             ts_message_set_int((TsMessageRef_t)value_local,pcStack_20->string,pcStack_20->valueint)
        ;
      }
    }
    else if (iVar1 == 0x10) {
      content._4_4_ =
           ts_message_set_string
                     ((TsMessageRef_t)value_local,pcStack_20->string,pcStack_20->valuestring);
    }
    else {
      if (iVar1 == 0x20) {
        return TsStatusErrorNotImplemented;
      }
      if (iVar1 != 0x40) {
        return TsStatusErrorNotImplemented;
      }
      content._4_4_ =
           ts_message_create_message((TsMessageRef_t)value_local,pcStack_20->string,&local_30);
      if (content._4_4_ == TsStatusOk) {
        content._4_4_ = ts_message_decode_json(local_30,pcStack_20->child);
      }
    }
    pcStack_20 = pcStack_20->next;
  } while( true );
}

Assistant:

TsStatus_t ts_message_decode_json(TsMessageRef_t message, cJSON *value)
{
	/* decode each node in the current value */
	TsStatus_t status = TsStatusOk;
	while (value != NULL) {

		/* decode current node */
		switch (value->type) {

		case cJSON_NULL:
			status = ts_message_set_null(message, value->string);
			break;

		case cJSON_Number:
			if (value->valuedouble == (double) (value->valueint)) {
				status = ts_message_set_int(message, value->string, value->valueint);
			} else {
				status = ts_message_set_float(message, value->string, (float) (value->valuedouble));
			}
			break;

		case cJSON_String:
			status = ts_message_set_string(message, value->string, value->valuestring);
			break;

		case cJSON_True:
			status = ts_message_set_bool(message, value->string, true);
			break;

		case cJSON_False:
			status = ts_message_set_bool(message, value->string, false);
			break;

		case cJSON_Object: {

			TsMessageRef_t content;
			status = ts_message_create_message(message, value->string, &content);
			if (status == TsStatusOk) {
				status = ts_message_decode_json(content, value->child);
			}
			break;
		}
		case cJSON_Array:
			/* TODO */
			/* fallthrough */

		case cJSON_Invalid:
		case cJSON_Raw:
		default:
			return TsStatusErrorNotImplemented;
		}

		/* get next sibling */
		value = value->next;
	}
	return status;
}